

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenGEXImporter.cpp
# Opt level: O1

void __thiscall
Assimp::OpenGEX::OpenGEXImporter::handleNodes(OpenGEXImporter *this,DDLNode *node,aiScene *pScene)

{
  int iVar1;
  uint uVar2;
  DllNodeList *__x;
  aiScene *extraout_RDX;
  aiScene *extraout_RDX_00;
  aiScene *extraout_RDX_01;
  aiScene *extraout_RDX_02;
  aiScene *extraout_RDX_03;
  aiScene *extraout_RDX_04;
  aiScene *extraout_RDX_05;
  aiScene *extraout_RDX_06;
  aiScene *extraout_RDX_07;
  aiScene *extraout_RDX_08;
  aiScene *extraout_RDX_09;
  aiScene *extraout_RDX_10;
  aiScene *extraout_RDX_11;
  aiScene *extraout_RDX_12;
  aiScene *extraout_RDX_13;
  aiScene *extraout_RDX_14;
  aiScene *extraout_RDX_15;
  aiScene *extraout_RDX_16;
  aiScene *extraout_RDX_17;
  aiScene *extraout_RDX_18;
  aiScene *paVar3;
  pointer ppDVar4;
  DllNodeList childs;
  vector<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_> local_48;
  
  if (node != (DDLNode *)0x0) {
    __x = ODDLParser::DDLNode::getChildNodeList(node);
    std::vector<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>::vector
              (&local_48,__x);
    ppDVar4 = local_48.
              super__Vector_base<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (local_48.super__Vector_base<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        local_48.super__Vector_base<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      do {
        ODDLParser::DDLNode::getType_abi_cxx11_(*ppDVar4);
        iVar1 = std::__cxx11::string::compare(Grammar::MetricType_abi_cxx11_);
        if (iVar1 == 0) {
          uVar2 = 0;
          paVar3 = extraout_RDX;
        }
        else {
          iVar1 = std::__cxx11::string::compare(Grammar::NameType_abi_cxx11_);
          if (iVar1 == 0) {
            uVar2 = 1;
            paVar3 = extraout_RDX_00;
          }
          else {
            iVar1 = std::__cxx11::string::compare(Grammar::ObjectRefType_abi_cxx11_);
            if (iVar1 == 0) {
              uVar2 = 2;
              paVar3 = extraout_RDX_01;
            }
            else {
              iVar1 = std::__cxx11::string::compare(Grammar::MaterialRefType_abi_cxx11_);
              if (iVar1 == 0) {
                uVar2 = 3;
                paVar3 = extraout_RDX_02;
              }
              else {
                iVar1 = std::__cxx11::string::compare(Grammar::MetricKeyType_abi_cxx11_);
                if (iVar1 == 0) {
                  uVar2 = 4;
                  paVar3 = extraout_RDX_03;
                }
                else {
                  iVar1 = std::__cxx11::string::compare(Grammar::GeometryNodeType_abi_cxx11_);
                  if (iVar1 == 0) {
                    uVar2 = 5;
                    paVar3 = extraout_RDX_04;
                  }
                  else {
                    iVar1 = std::__cxx11::string::compare(Grammar::CameraNodeType_abi_cxx11_);
                    if (iVar1 == 0) {
                      uVar2 = 6;
                      paVar3 = extraout_RDX_05;
                    }
                    else {
                      iVar1 = std::__cxx11::string::compare(Grammar::LightNodeType_abi_cxx11_);
                      if (iVar1 == 0) {
                        uVar2 = 7;
                        paVar3 = extraout_RDX_06;
                      }
                      else {
                        iVar1 = std::__cxx11::string::compare
                                          (Grammar::GeometryObjectType_abi_cxx11_);
                        if (iVar1 == 0) {
                          uVar2 = 8;
                          paVar3 = extraout_RDX_07;
                        }
                        else {
                          iVar1 = std::__cxx11::string::compare
                                            (Grammar::CameraObjectType_abi_cxx11_);
                          if (iVar1 == 0) {
                            uVar2 = 9;
                            paVar3 = extraout_RDX_08;
                          }
                          else {
                            iVar1 = std::__cxx11::string::compare
                                              (Grammar::LightObjectType_abi_cxx11_);
                            if (iVar1 == 0) {
                              uVar2 = 10;
                              paVar3 = extraout_RDX_09;
                            }
                            else {
                              iVar1 = std::__cxx11::string::compare
                                                (Grammar::TransformType_abi_cxx11_);
                              if (iVar1 == 0) {
                                uVar2 = 0xb;
                                paVar3 = extraout_RDX_10;
                              }
                              else {
                                iVar1 = std::__cxx11::string::compare(Grammar::MeshType_abi_cxx11_);
                                if (iVar1 == 0) {
                                  uVar2 = 0xc;
                                  paVar3 = extraout_RDX_11;
                                }
                                else {
                                  iVar1 = std::__cxx11::string::compare
                                                    (Grammar::VertexArrayType_abi_cxx11_);
                                  if (iVar1 == 0) {
                                    uVar2 = 0xd;
                                    paVar3 = extraout_RDX_12;
                                  }
                                  else {
                                    iVar1 = std::__cxx11::string::compare
                                                      (Grammar::IndexArrayType_abi_cxx11_);
                                    if (iVar1 == 0) {
                                      uVar2 = 0xe;
                                      paVar3 = extraout_RDX_13;
                                    }
                                    else {
                                      iVar1 = std::__cxx11::string::compare
                                                        (Grammar::MaterialType_abi_cxx11_);
                                      if (iVar1 == 0) {
                                        uVar2 = 0xf;
                                        paVar3 = extraout_RDX_14;
                                      }
                                      else {
                                        iVar1 = std::__cxx11::string::compare
                                                          (Grammar::ColorType_abi_cxx11_);
                                        if (iVar1 == 0) {
                                          uVar2 = 0x10;
                                          paVar3 = extraout_RDX_15;
                                        }
                                        else {
                                          iVar1 = std::__cxx11::string::compare
                                                            (Grammar::ParamType_abi_cxx11_);
                                          if (iVar1 == 0) {
                                            uVar2 = 0x11;
                                            paVar3 = extraout_RDX_16;
                                          }
                                          else {
                                            iVar1 = std::__cxx11::string::compare
                                                              (Grammar::TextureType_abi_cxx11_);
                                            if (iVar1 == 0) {
                                              uVar2 = 0x12;
                                              paVar3 = extraout_RDX_17;
                                            }
                                            else {
                                              iVar1 = std::__cxx11::string::compare
                                                                (Grammar::AttenType_abi_cxx11_);
                                              uVar2 = -(uint)(iVar1 != 0) | 0x13;
                                              paVar3 = extraout_RDX_18;
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        switch(uVar2) {
        case 0:
          handleMetricNode(this,*ppDVar4,paVar3);
          break;
        case 1:
          handleNameNode(this,*ppDVar4,paVar3);
          break;
        case 2:
          handleObjectRefNode(this,*ppDVar4,paVar3);
          break;
        case 3:
          handleMaterialRefNode(this,*ppDVar4,paVar3);
          break;
        case 5:
          handleGeometryNode(this,*ppDVar4,pScene);
          break;
        case 6:
          handleCameraNode(this,*ppDVar4,pScene);
          break;
        case 7:
          handleLightNode(this,*ppDVar4,pScene);
          break;
        case 8:
        case 9:
          handleNodes(this,*ppDVar4,pScene);
          break;
        case 10:
          handleLightObject(this,*ppDVar4,pScene);
          break;
        case 0xb:
          handleTransformNode(this,*ppDVar4,paVar3);
          break;
        case 0xc:
          handleMeshNode(this,*ppDVar4,pScene);
          break;
        case 0xd:
          handleVertexArrayNode(this,*ppDVar4,paVar3);
          break;
        case 0xe:
          handleIndexArrayNode(this,*ppDVar4,paVar3);
          break;
        case 0xf:
          handleMaterialNode(this,*ppDVar4,pScene);
          break;
        case 0x10:
          handleColorNode(this,*ppDVar4,paVar3);
          break;
        case 0x11:
          handleParamNode(this,*ppDVar4,paVar3);
          break;
        case 0x12:
          handleTextureNode(this,*ppDVar4,paVar3);
        }
        ppDVar4 = ppDVar4 + 1;
      } while (ppDVar4 !=
               local_48.
               super__Vector_base<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>.
               _M_impl.super__Vector_impl_data._M_finish);
    }
    if (local_48.super__Vector_base<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.
                      super__Vector_base<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_48.
                            super__Vector_base<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.
                            super__Vector_base<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void OpenGEXImporter::handleNodes( DDLNode *node, aiScene *pScene ) {
    if( nullptr == node ) {
        return;
    }

    DDLNode::DllNodeList childs = node->getChildNodeList();
    for( DDLNode::DllNodeList::iterator it = childs.begin(); it != childs.end(); ++it ) {
        Grammar::TokenType tokenType( Grammar::matchTokenType( ( *it )->getType().c_str() ) );
        switch( tokenType ) {
            case Grammar::MetricToken:
                handleMetricNode( *it, pScene );
                break;

            case Grammar::NameToken:
                handleNameNode( *it, pScene );
                break;

            case Grammar::ObjectRefToken:
                handleObjectRefNode( *it, pScene );
                break;

            case Grammar::MaterialRefToken:
                handleMaterialRefNode( *it, pScene );
                break;

            case Grammar::MetricKeyToken:
                break;

            case Grammar::GeometryNodeToken:
                handleGeometryNode( *it, pScene );
                break;

            case Grammar::CameraNodeToken:
                handleCameraNode( *it, pScene );
                break;

            case Grammar::LightNodeToken:
                handleLightNode( *it, pScene );
                break;

            case Grammar::GeometryObjectToken:
                handleGeometryObject( *it, pScene );
                break;

            case Grammar::CameraObjectToken:
                handleCameraObject( *it, pScene );
                break;

            case Grammar::LightObjectToken:
                handleLightObject( *it, pScene );
                break;

            case Grammar::TransformToken:
                handleTransformNode( *it, pScene );
                break;

            case Grammar::MeshToken:
                handleMeshNode( *it, pScene );
                break;

            case Grammar::VertexArrayToken:
                handleVertexArrayNode( *it, pScene );
                break;

            case Grammar::IndexArrayToken:
                handleIndexArrayNode( *it, pScene );
                break;

            case Grammar::MaterialToken:
                handleMaterialNode( *it, pScene );
                break;

            case Grammar::ColorToken:
                handleColorNode( *it, pScene );
                break;

            case Grammar::ParamToken:
                handleParamNode( *it, pScene );
                break;

            case Grammar::TextureToken:
                handleTextureNode( *it, pScene );
                break;

            default:
                break;
        }
    }
}